

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testSpecDowngrade(void)

{
  RepeatedField<long> *this;
  int iVar1;
  Rep *pRVar2;
  ulong uVar3;
  bool bVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetworkLayer *pNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  void *pvVar11;
  LayerUnion LVar12;
  Model *pMVar13;
  ostream *poVar14;
  undefined8 *puVar15;
  uint uVar16;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar18;
  uint uVar19;
  Model m1;
  Model mlmodel;
  Result res;
  Model MStack_98;
  Model local_68;
  Result local_50;
  
  CoreML::Specification::Model::Model(&MStack_98,(Arena *)0x0,false);
  MStack_98.specificationversion_ = 9;
  if (MStack_98.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(MStack_98.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_98.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    MStack_98.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar2 = ((MStack_98.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001819dc:
    pRVar17 = &(MStack_98.description_)->input_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar1 = ((MStack_98.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_001819dc;
    ((MStack_98.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar11 = pRVar2->elements[iVar1];
  }
  puVar15 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar15 = (undefined8 *)*puVar15;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"input",puVar15);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x10040;
  this = &pAVar8->shape_;
  uVar16 = (pAVar8->shape_).current_size_;
  if (uVar16 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar16 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar16] = 10;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar16] = 10;
  }
  uVar19 = uVar16 + 1;
  (pAVar8->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar16 + 2);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 0xb;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 0xb;
  }
  uVar19 = uVar16 + 2;
  (pAVar8->shape_).current_size_ = uVar19;
  if (uVar19 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar16 + 3);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 0xc;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar19] = 0xc;
  }
  this->current_size_ = uVar16 + 3;
  if (MStack_98.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(MStack_98.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_98.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    MStack_98.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar2 = ((MStack_98.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00181ba1:
    pRVar17 = &(MStack_98.description_)->output_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar1 = ((MStack_98.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_00181ba1;
    ((MStack_98.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar11 = pRVar2->elements[iVar1];
  }
  puVar15 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar15 = (undefined8 *)*puVar15;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"probs",puVar15);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x10040;
  if (MStack_98._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_98);
    MStack_98._oneof_case_[0] = 500;
    pAVar18 = (Arena *)(MStack_98.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_98.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    MStack_98.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar18);
  }
  pRVar2 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_98.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00181ca6:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_98.Type_.pipeline_)->models_;
    pNVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                       ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar9 = (NeuralNetworkLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       ((RepeatedPtrFieldBase *)this_00,pNVar9);
  }
  else {
    iVar1 = (MStack_98.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_00181ca6;
    (MStack_98.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar9 = (NeuralNetworkLayer *)pRVar2->elements[iVar1];
  }
  pRVar2 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00181cde:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar9->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar9->input_).super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar1 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_00181cde;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar11 = pRVar2->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3a8ef3);
  pRVar2 = (pNVar9->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar11 = pRVar2->elements[iVar1];
      goto LAB_00181d48;
    }
  }
  pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar9->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar9->output_).super_RepeatedPtrFieldBase,pbVar10);
LAB_00181d48:
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3977ad);
  if (pNVar9->_oneof_case_[0] == 0x15e) {
    LVar12 = pNVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar9);
    pNVar9->_oneof_case_[0] = 0x15e;
    uVar3 = (pNVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    LVar12.slice_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SliceLayerParams>
                   (pAVar18);
    (pNVar9->layer_).slice_ = (SliceLayerParams *)LVar12;
  }
  (LVar12.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0x5;
  (LVar12.lrn_)->localsize_ = 0xfffffffffffffffd;
  (LVar12.innerproduct_)->inputchannels_ = 2;
  CoreML::validate<(MLModelType)500>(&local_50,&MStack_98);
  bVar4 = CoreML::Result::good(&local_50);
  if (bVar4) {
    CoreML::Model::Model(&local_68,&MStack_98);
    pMVar13 = CoreML::Model::getProto(&local_68);
    bVar4 = pMVar13->specificationversion_ != 1;
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xfef);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,
                 "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11",
                 0x50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
    uVar16 = (uint)bVar4;
    CoreML::Model::~Model(&local_68);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xfeb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    uVar16 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_98);
  return uVar16;
}

Assistant:

int testSpecDowngrade() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    auto *params = layer->mutable_slice();

    params->set_startindex(5);
    // The validator can't know if the input is big enough for this or not
    params->set_endindex(-3);
    params->set_stride(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11);

    return 0;

}